

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

void helper_pack(CPUS390XState_conflict *env,uint32_t len,uint64_t dest,uint64_t src)

{
  uint32_t uVar1;
  byte bVar2;
  target_ulong ptr;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uintptr_t unaff_retaddr;
  target_ulong local_48;
  
  uVar6 = len >> 4;
  local_48 = src + (len & 0xf);
  uVar1 = cpu_ldub_data_ra_s390x(env,local_48,unaff_retaddr);
  cpu_stb_data_ra_s390x(env,uVar6 + dest,(uVar1 & 0xff) >> 4 | (uVar1 & 0xff) << 4,unaff_retaddr);
  if (0xf < len) {
    iVar3 = (len & 0xf) - 1;
    local_48 = local_48 - 1;
    iVar5 = uVar6 + 1;
    ptr = dest + uVar6;
    do {
      ptr = ptr - 1;
      if (iVar3 < 0) {
        bVar2 = 0;
        iVar4 = -1;
      }
      else {
        uVar1 = cpu_ldub_data_ra_s390x(env,local_48,unaff_retaddr);
        bVar2 = (byte)uVar1 & 0xf;
        local_48 = local_48 - 1;
        iVar4 = iVar3 + -1;
      }
      iVar3 = -1;
      if (-1 < iVar4) {
        uVar1 = cpu_ldub_data_ra_s390x(env,local_48,unaff_retaddr);
        bVar2 = (char)uVar1 << 4 | bVar2;
        local_48 = local_48 - 1;
        iVar3 = iVar4 + -1;
      }
      cpu_stb_data_ra_s390x(env,ptr,(uint)bVar2,unaff_retaddr);
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
  }
  return;
}

Assistant:

void HELPER(pack)(CPUS390XState *env, uint32_t len, uint64_t dest, uint64_t src)
{
    uintptr_t ra = GETPC();
    int len_dest = len >> 4;
    int len_src = len & 0xf;
    uint8_t b;

    dest += len_dest;
    src += len_src;

    /* last byte is special, it only flips the nibbles */
    b = cpu_ldub_data_ra(env, src, ra);
    cpu_stb_data_ra(env, dest, (b << 4) | (b >> 4), ra);
    src--;
    len_src--;

    /* now pack every value */
    while (len_dest > 0) {
        b = 0;

        if (len_src >= 0) {
            b = cpu_ldub_data_ra(env, src, ra) & 0x0f;
            src--;
            len_src--;
        }
        if (len_src >= 0) {
            b |= cpu_ldub_data_ra(env, src, ra) << 4;
            src--;
            len_src--;
        }

        len_dest--;
        dest--;
        cpu_stb_data_ra(env, dest, b, ra);
    }
}